

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format,
               void *p_clamp_min,void *p_clamp_max)

{
  bool bVar1;
  int iVar2;
  char *format_00;
  size_t sVar3;
  void *p_min;
  ImGuiInputTextFlags flags;
  char fmt_buf [32];
  undefined1 local_80 [8];
  char local_78 [32];
  char local_58 [40];
  
  format_00 = ImParseFormatTrimDecorations(format,local_58,0x20);
  DataTypeFormatString(local_78,0x20,data_type,p_data,format_00);
  ImStrTrimBlanks(local_78);
  flags = 0x8020010;
  if ((data_type & 0xfffffffeU) != 8) {
    if (*format_00 == '\0') {
      flags = 0x8000011;
    }
    else {
      sVar3 = strlen(format_00);
      flags = ((format_00[sVar3 - 1] & 0xdfU) == 0x58) + 0x8000011;
    }
  }
  bVar1 = TempInputText(bb,id,label,local_78,0x20,flags);
  if (bVar1) {
    if (9 < (uint)data_type) {
      __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_widgets.cpp"
                    ,0x788,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
    }
    sVar3 = GDataTypeInfo[(uint)data_type].Size;
    memcpy(local_80,p_data,sVar3);
    DataTypeApplyFromText(local_78,data_type,p_data,format_00);
    if (p_clamp_min != (void *)0x0 || p_clamp_max != (void *)0x0) {
      p_min = p_clamp_min;
      if ((p_clamp_min != (void *)0x0 && p_clamp_max != (void *)0x0) &&
         (iVar2 = DataTypeCompare(data_type,p_clamp_min,p_clamp_max), 0 < iVar2)) {
        p_min = p_clamp_max;
        p_clamp_max = p_clamp_min;
      }
      DataTypeClamp(data_type,p_data,p_min,p_clamp_max);
    }
    iVar2 = bcmp(local_80,p_data,sVar3);
    bVar1 = iVar2 != 0;
    if (bVar1) {
      MarkItemEdited(id);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format, const void* p_clamp_min, const void* p_clamp_max)
{
    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= InputScalar_DefaultCharsFilter(data_type, format);

    bool value_changed = false;
    if (TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags))
    {
        // Backup old value
        size_t data_type_size = DataTypeGetInfo(data_type)->Size;
        ImGuiDataTypeTempStorage data_backup;
        memcpy(&data_backup, p_data, data_type_size);

        // Apply new value (or operations) then clamp
        DataTypeApplyFromText(data_buf, data_type, p_data, format);
        if (p_clamp_min || p_clamp_max)
        {
            if (p_clamp_min && p_clamp_max && DataTypeCompare(data_type, p_clamp_min, p_clamp_max) > 0)
                ImSwap(p_clamp_min, p_clamp_max);
            DataTypeClamp(data_type, p_data, p_clamp_min, p_clamp_max);
        }

        // Only mark as edited if new value is different
        value_changed = memcmp(&data_backup, p_data, data_type_size) != 0;
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}